

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_DETECT_TRAPS(effect_handler_context_t_conflict *context)

{
  chunk_conflict *c;
  _Bool _Var1;
  loc lVar2;
  object *obj;
  square *psVar3;
  int iVar4;
  int y;
  int iVar5;
  int iVar6;
  char *fmt;
  int iVar7;
  bool bVar8;
  bool bVar9;
  
  iVar5 = (player->grid).x;
  iVar4 = (player->grid).y;
  y = iVar4 - context->y;
  iVar4 = context->y + iVar4;
  iVar7 = iVar5 - context->x;
  iVar5 = context->x + iVar5;
  if (y < 1) {
    y = 0;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  iVar6 = cave->height + -1;
  if (iVar4 < cave->height) {
    iVar6 = iVar4;
  }
  iVar4 = cave->width + -1;
  if (iVar5 < cave->width) {
    iVar4 = iVar5;
  }
  if (y < iVar6) {
    bVar8 = false;
    bVar9 = false;
    do {
      iVar5 = iVar7;
      if (iVar7 < iVar4) {
        do {
          lVar2 = (loc)loc(iVar5,y);
          _Var1 = square_in_bounds_fully(cave,lVar2);
          if (_Var1) {
            _Var1 = square_isplayertrap(cave,lVar2);
            if (_Var1) {
              _Var1 = square_reveal_trap((chunk *)cave,lVar2,true,false);
              bVar9 = bVar8;
              if (_Var1) {
                bVar8 = true;
                bVar9 = true;
              }
            }
            obj = square_object(cave,lVar2);
            c = cave;
            for (; cave = c, obj != (object *)0x0; obj = obj->next) {
              _Var1 = is_trapped_chest(obj);
              if (((_Var1) && (_Var1 = ignore_item_ok(player,obj), !_Var1)) &&
                 ((obj->known == (object *)0x0 || (obj->known->pval != obj->pval)))) {
                object_see(player,obj);
                obj->known->pval = obj->pval;
                bVar8 = true;
                bVar9 = true;
              }
              c = cave;
            }
            lVar2 = (loc)loc(iVar5,y);
            psVar3 = square(c,lVar2);
            flag_on_dbg(psVar3->info,3,0x13,"square(cave, loc(x, y))->info","SQUARE_DTRAP");
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar4);
      }
      y = y + 1;
    } while (y != iVar6);
    if (bVar9) {
      fmt = "You sense the presence of traps!";
      goto LAB_0013ed77;
    }
  }
  fmt = "You sense no traps.";
LAB_0013ed77:
  msg(fmt);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_TRAPS(effect_handler_context_t *context)
{
	int x, y;
	int x1, x2, y1, y2;

	bool detect = false;

	struct object *obj;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;


	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Detect traps */
			if (square_isplayertrap(cave, grid))
				/* Reveal trap */
				if (square_reveal_trap(cave, grid, true, false))
					detect = true;

			/* Scan all objects in the grid to look for traps on chests */
			for (obj = square_object(cave, grid); obj; obj = obj->next) {
				/* Skip anything not a trapped chest */
				if (!is_trapped_chest(obj)
						|| ignore_item_ok(player, obj)) {
					continue;
				}

				/* Identify once */
				if (!obj->known || obj->known->pval != obj->pval) {
					/* Hack - see the object */
					object_see(player, obj);

					/* Know the trap */
					obj->known->pval = obj->pval;

					/* We found something to detect */
					detect = true;
				}
			}
			/* Mark as trap-detected */
			sqinfo_on(square(cave, loc(x, y))->info, SQUARE_DTRAP);
		}
	}

	/* Describe */
	if (detect)
		msg("You sense the presence of traps!");

	/* Trap detection always makes you aware, even if no traps are present */
	else
		msg("You sense no traps.");

	/* Notice */
	context->ident = true;

	return true;
}